

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

char * map_next_(map_base_t *m,map_iter_t *iter)

{
  uint uVar1;
  uint uVar2;
  map_node_t *pmVar3;
  uint uVar4;
  
  if ((iter->node == (map_node_t *)0x0) ||
     (pmVar3 = iter->node->next, iter->node = pmVar3, pmVar3 == (map_node_t *)0x0)) {
    uVar2 = m->nbuckets;
    uVar4 = iter->bucketidx;
    do {
      uVar1 = uVar4 + 1;
      if (uVar2 <= uVar1) {
        iter->bucketidx = uVar4 + 1;
        return (char *)0x0;
      }
      pmVar3 = m->buckets[uVar1];
      iter->node = pmVar3;
      uVar4 = uVar1;
    } while (pmVar3 == (map_node_t *)0x0);
    iter->bucketidx = uVar1;
  }
  return (char *)(iter->node + 1);
}

Assistant:

const char *map_next_(map_base_t *m, map_iter_t *iter) {
  if (iter->node) {
    iter->node = iter->node->next;
    if (iter->node == NULL) goto nextBucket;
  } else {
    nextBucket:
    do {
      if (++iter->bucketidx >= m->nbuckets) {
        return NULL;
      }
      iter->node = m->buckets[iter->bucketidx];
    } while (iter->node == NULL);
  }
  return (char*) (iter->node + 1);
}